

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  int j;
  ulong uVar5;
  allocator<char> local_169;
  Matx<double,_4,_1> local_168;
  undefined8 local_140;
  undefined8 local_138;
  _InputArray local_130;
  shared_ptr<ls::LSDDetection> lsd;
  vector<ls::lsd_segment,_std::allocator<ls::lsd_segment>_> segments;
  Mat result;
  Mat img;
  int *local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"/home/soumyadeep/test.jpg",(allocator<char> *)&local_168);
  cv::imread((string *)&img,(int)&result);
  std::__cxx11::string::~string((string *)&result);
  cv::Mat::clone();
  iVar1 = *local_50;
  iVar2 = local_50[1];
  poVar3 = std::operator<<((ostream *)&std::cout,"[");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
  poVar3 = std::operator<<(poVar3," x ");
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
  poVar3 = std::operator<<(poVar3,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  ls::createLSDDetector((ls *)&lsd,&img);
  ls::LSDDetection::detectLines
            (&segments,lsd.super___shared_ptr<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  lVar4 = 8;
  uVar5 = 0;
  while( true ) {
    if ((ulong)(((long)segments.
                       super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)segments.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar5) break;
    local_138 = *(undefined8 *)
                 ((long)segments.
                        super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
    local_140 = *(undefined8 *)
                 ((long)&((segments.
                           super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>.
                           _M_impl.super__Vector_impl_data._M_start)->p1).x + lVar4);
    local_130.sz.width = 0;
    local_130.sz.height = 0;
    local_130.flags = 0x3010000;
    local_130.obj = &result;
    cv::Matx<double,_4,_1>::Matx(&local_168);
    local_168.val[0] = 0.0;
    local_168.val[1] = 0.0;
    local_168.val[2] = 255.0;
    local_168.val[3] = 0.0;
    cv::line(&local_130,&local_138,&local_140,&local_168,2,0x10,0);
    uVar5 = uVar5 + 1;
    lVar4 = lVar4 + 0x14;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"image",&local_169);
  local_130.sz.width = 0;
  local_130.sz.height = 0;
  local_130.flags = 0x1010000;
  local_130.obj = &img;
  cv::imshow((string *)&local_168,&local_130);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"result_img",&local_169);
  local_130.sz.width = 0;
  local_130.sz.height = 0;
  local_130.flags = 0x1010000;
  local_130.obj = &result;
  cv::imshow((string *)&local_168,&local_130);
  std::__cxx11::string::~string((string *)&local_168);
  cv::waitKey(0);
  std::_Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>::~_Vector_base
            (&segments.super__Vector_base<ls::lsd_segment,_std::allocator<ls::lsd_segment>_>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&lsd.super___shared_ptr<ls::LSDDetection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cv::Mat::~Mat(&result);
  cv::Mat::~Mat(&img);
  return 0;
}

Assistant:

int main()
{
    const cv::Mat img = cv::imread("/home/soumyadeep/test.jpg");
    cv::Mat result = img.clone();
    std::cout<<img.size()<<std::endl;
    auto lsd = createLSDDetector(img);
    auto segments = lsd->detectLines();

    
    cv::Point pt1, pt2;
    for (int j = 0; j < segments.size(); ++j) {
    	pt1 = segments[j].p1;
    	pt2 = segments[j].p2;

    	cv::line(result, pt1, pt2, cv::Scalar(0, 0, 255), 2, cv::LINE_AA);
    }

    cv::imshow("image", img);
    cv::imshow("result_img", result);
    cv::waitKey();
    return 0;
}